

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::MultiplyLayerParams::MergePartialFromCodedStream
          (MultiplyLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  float *pfVar3;
  bool bVar4;
  bool bVar5;
  uint32 uVar6;
  uint tag;
  ulong uVar7;
  float fVar8;
  float local_2c;
  
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0013ce98;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0013ce98:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar7 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar6 | uVar7;
    }
    tag = (uint)uVar7;
    if (((uVar7 & 0x100000000) == 0) || ((char)uVar7 != '\r' || (tag & 0xfffffff8) != 8)) {
      bVar5 = (tag & 7) == 4 || tag == 0;
      if (bVar5) {
        return bVar5;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,tag);
      if (!bVar4) {
        return bVar5;
      }
    }
    else {
      pfVar3 = (float *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pfVar3 < 4) {
        bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)&local_2c);
        fVar8 = local_2c;
        if (!bVar5) {
          return false;
        }
      }
      else {
        fVar8 = *pfVar3;
        input->buffer_ = (uint8 *)(pfVar3 + 1);
      }
      this->alpha_ = fVar8;
    }
  } while( true );
}

Assistant:

bool MultiplyLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.MultiplyLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // float alpha = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(13u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &alpha_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.MultiplyLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.MultiplyLayerParams)
  return false;
#undef DO_
}